

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31sVertexAttributeBindingTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Stress::anon_unknown_0::BindVertexBufferCase::iterate(BindVertexBufferCase *this)

{
  ostringstream *this_00;
  RenderContext *context;
  int iVar1;
  GLuint index;
  GLenum GVar2;
  undefined4 extraout_var;
  RenderTarget *pRVar3;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  CallLogWrapper gl;
  Surface dst;
  VertexArray vao;
  CallLogWrapper local_1f0;
  Surface local_1d8;
  Enum<int,_2UL> local_1c0;
  ObjectWrapper local_1b0;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  glu::CallLogWrapper::CallLogWrapper
            (&local_1f0,(Functions *)CONCAT44(extraout_var,iVar1),
             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  index = glu::CallLogWrapper::glGetAttribLocation
                    (&local_1f0,(this->m_program->m_program).m_program,"a_position");
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar3->m_width;
  pRVar3 = Context::getRenderTarget((this->super_TestCase).m_context);
  tcu::Surface::Surface(&local_1d8,iVar1,pRVar3->m_height);
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1b0,(Functions *)CONCAT44(extraout_var_00,iVar1),traits);
  local_1f0.m_enableLog = true;
  glu::CallLogWrapper::glClearColor(&local_1f0,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear(&local_1f0,0x4000);
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
  glu::checkError(GVar2,"setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x248);
  glu::CallLogWrapper::glUseProgram(&local_1f0,(this->m_program->m_program).m_program);
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
  glu::checkError(GVar2,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x24b);
  glu::CallLogWrapper::glBindVertexArray(&local_1f0,local_1b0.m_object);
  glu::CallLogWrapper::glEnableVertexAttribArray(&local_1f0,index);
  glu::CallLogWrapper::glVertexAttribFormat(&local_1f0,index,4,0x1406,'\0',0);
  glu::CallLogWrapper::glVertexAttribBinding(&local_1f0,index,0);
  glu::CallLogWrapper::glBindVertexBuffer(&local_1f0,0,this->m_buffer,(long)this->m_offset,0x10);
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
  glu::checkError(GVar2,"set buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/stress/es31sVertexAttributeBindingTests.cpp"
                  ,0x252);
  glu::CallLogWrapper::glDrawArrays(&local_1f0,0,0,this->m_drawCount);
  GVar2 = glu::CallLogWrapper::glGetError(&local_1f0);
  if (GVar2 != 0) {
    local_198._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Got error: ",0xb);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = GVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ignoring...",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
  }
  glu::CallLogWrapper::glFinish(&local_1f0);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_1c0.m_getName = (GetNameFunc)0x300000008;
  if ((void *)local_1d8.m_pixels.m_cap != (void *)0x0) {
    local_1d8.m_pixels.m_cap = (size_t)local_1d8.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_198,(TextureFormat *)&local_1c0,local_1d8.m_width,
             local_1d8.m_height,1,(void *)local_1d8.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_198);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::ObjectWrapper::~ObjectWrapper(&local_1b0);
  tcu::Surface::~Surface(&local_1d8);
  glu::CallLogWrapper::~CallLogWrapper(&local_1f0);
  return STOP;
}

Assistant:

BindVertexBufferCase::IterateResult BindVertexBufferCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const deInt32			positionLoc = gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			dst			(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	glu::VertexArray		vao			(m_context.getRenderContext());

	gl.enableLogging(true);

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	gl.glBindVertexArray(*vao);
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glVertexAttribFormat(positionLoc, 4, GL_FLOAT, GL_FALSE, 0);
	gl.glVertexAttribBinding(positionLoc, 0);
	gl.glBindVertexBuffer(0, m_buffer, m_offset, int(sizeof(tcu::Vec4)));
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set buffer");

	gl.glDrawArrays(GL_POINTS, 0, m_drawCount);

	// allow errors after attempted out-of-bounds memory access
	{
		const deUint32 error = gl.glGetError();

		if (error != GL_NO_ERROR)
			m_testCtx.getLog() << tcu::TestLog::Message << "Got error: " << glu::getErrorStr(error) << ", ignoring..." << tcu::TestLog::EndMessage;
	}

	// read pixels to wait for rendering
	gl.glFinish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}